

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this)

{
  bool bVar1;
  bool local_11;
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_local;
  
  bVar1 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
          AllocatorsAreEmpty((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this);
  local_11 = false;
  if (bVar1) {
    bVar1 = HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
            AllocatorsAreEmpty((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                                *)&this->finalizableHeapBucket);
    local_11 = false;
    if (bVar1) {
      bVar1 = HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
              AllocatorsAreEmpty(&(this->leafHeapBucket).
                                  super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                                );
      local_11 = false;
      if (bVar1) {
        bVar1 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                ::AllocatorsAreEmpty
                          ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                            *)&this->smallNormalWithBarrierHeapBucket);
        local_11 = false;
        if (bVar1) {
          local_11 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                     ::AllocatorsAreEmpty
                               ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                                 *)&this->smallFinalizableWithBarrierHeapBucket);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool
HeapBucketGroup<TBlockAttributes>::AllocatorsAreEmpty()
{
    return heapBucket.AllocatorsAreEmpty()
        && finalizableHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_VISITED_HOST
        && recyclerVisitedHostHeapBucket.AllocatorsAreEmpty()
#endif
        && leafHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_WRITE_BARRIER
        && smallNormalWithBarrierHeapBucket.AllocatorsAreEmpty()
        && smallFinalizableWithBarrierHeapBucket.AllocatorsAreEmpty()
#endif
        ;
}